

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

void __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
::tuple_base(tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
             *this,tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                   *param_1)

{
  Fixpp::Field<Fixpp::TagT<888U,_Fixpp::Type::String>_>::Field
            ((Field<Fixpp::TagT<888U,_Fixpp::Type::String>_> *)this,
             (Field<Fixpp::TagT<888U,_Fixpp::Type::String>_> *)param_1);
  Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>::Field
            (&(this->
              super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>,_false>).
              value,&(param_1->
                     super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<889U,_Fixpp::Type::String>_>,_false>
                     ).value);
  return;
}

Assistant:

tuple_base( tuple_base&& ) = default;